

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QCborArray __thiscall QCborArray::fromStringList(QCborArray *this,QStringList *list)

{
  QString *s;
  QString *s_00;
  long lVar1;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborArray(this);
  detach(this,(list->d).size);
  s_00 = (list->d).ptr;
  for (lVar1 = (list->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    QCborContainerPrivate::append((this->d).d.ptr,s_00);
    s_00 = s_00 + 1;
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborArray QCborArray::fromStringList(const QStringList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QString &s : list)
        a.d->append(s);
    return a;
}